

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::InsertionSort<float>(float *list,uint32 length,CompareVarsInfo *cvInfo)

{
  bool bVar1;
  float local_3c;
  float local_38;
  float item;
  uint32 upperBound;
  uint32 insertPoint;
  uint32 lowerBound;
  uint32 sortedCount;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *compareType;
  CompareVarsInfo *cvInfo_local;
  float *pfStack_10;
  uint32 length_local;
  float *list_local;
  
  _lowerBound = cvInfo->compareType;
  compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)cvInfo;
  cvInfo_local._4_4_ = length;
  pfStack_10 = list;
  for (insertPoint = 1; insertPoint < cvInfo_local._4_4_; insertPoint = insertPoint + 1) {
    local_3c = pfStack_10[insertPoint];
    local_38 = (float)insertPoint;
    item = (float)(insertPoint - 1);
    upperBound = 0;
    while( true ) {
      bVar1 = (*_lowerBound)((CompareVarsInfo *)compareType,&local_3c,pfStack_10 + (uint)item);
      if (bVar1) {
        local_38 = item;
      }
      else {
        upperBound = (int)item + 1;
      }
      if ((uint)local_38 <= upperBound) break;
      item = (float)(upperBound + ((int)local_38 - upperBound >> 1));
    }
    for (item = (float)insertPoint; upperBound < (uint)item; item = (float)((int)item + -1)) {
      pfStack_10[(uint)item] = pfStack_10[(int)item - 1];
    }
    pfStack_10[upperBound] = local_3c;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }